

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfwfilm.c
# Opt level: O3

MMFWFilmEntry * MMFWFilmEntry_New(MMFW *mmfw,int i)

{
  uint uVar1;
  uint32_t uVar2;
  MMFWFilmEntry *pMVar3;
  uint8_t *__ptr;
  int iVar4;
  uint uVar5;
  
  pMVar3 = (MMFWFilmEntry *)malloc(0x10);
  if (pMVar3 != (MMFWFilmEntry *)0x0) {
    uVar1 = mmfw->offsets[i];
    uVar2 = mmfw->offsets[(long)i + 1];
    uVar5 = uVar2 - uVar1;
    pMVar3->length = uVar5;
    __ptr = (uint8_t *)malloc((ulong)uVar5);
    pMVar3->data = __ptr;
    fseek((FILE *)mmfw->fp,(ulong)uVar1,0);
    for (iVar4 = uVar2 - uVar1; iVar4 != 0; iVar4 = iVar4 + -1) {
      fread(__ptr,1,1,(FILE *)mmfw->fp);
      __ptr = __ptr + 1;
    }
  }
  return pMVar3;
}

Assistant:

MMFWFilmEntry *
MMFWFilmEntry_New(MMFW *mmfw, int i)
{
	MMFWFilmEntry *film = malloc(sizeof(MMFWFilmEntry));

	if (!film) {
		return NULL;
	}

	uint32_t offset = mmfw->offsets[i];
	uint32_t length = mmfw->offsets[i+1] - offset;

	film->length = length;
	film->data = malloc(film->length);

	fseek(mmfw->fp, (long)offset, SEEK_SET);

	/* XXX one byte at a time :\ */
	uint8_t *datap = film->data;
	for (int i = 0; i < film->length; i++) {
		fread(datap, 1, 1, mmfw->fp);
		datap++;
	}

	return film;
}